

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall cs::function::init_call_ptr(function *this)

{
  code *pcVar1;
  
  if (this->mIsVargs == false) {
    if (this->mIsLambda == true) {
      if ((this->mArgs).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->mArgs).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar1 = call_el;
      }
      else {
        pcVar1 = call_rl;
      }
    }
    else {
      pcVar1 = call_rr;
    }
  }
  else {
    pcVar1 = call_vv;
  }
  this->call_ptr = pcVar1;
  return;
}

Assistant:

inline void init_call_ptr() noexcept
		{
			if (!mIsVargs) {
				if (mIsLambda)
					call_ptr = mArgs.empty() ? &call_el : &call_rl;
				else
					call_ptr = &call_rr;
			}
			else
				call_ptr = &call_vv;
		}